

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O1

Am_Slot_Key Am_Register_Slot_Name(char *string)

{
  Am_Symbol_Table *pAVar1;
  Am_Symbol_Table *pAVar2;
  const_iterator cVar3;
  uint *puVar4;
  mapped_type *ppcVar5;
  uint uVar6;
  _Base_ptr *pp_Var7;
  char *local_28;
  
  if (Am_Slot_Name_Key_Table == (Am_Symbol_Table *)0x0) {
    Am_Slot_Name_Key_Table = Am_Symbol_Table::Create(500);
  }
  pAVar1 = Am_Slot_Name_Key_Table;
  local_28 = string;
  cVar3 = std::
          _Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
          ::find((_Rb_tree<const_char_*,_std::pair<const_char_*const,_int>,_std::_Select1st<std::pair<const_char_*const,_int>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                  *)Am_Slot_Name_Key_Table,&local_28);
  pAVar2 = Am_Slot_Name_Key_Table;
  pp_Var7 = (_Base_ptr *)&(pAVar1->Am_Map_CStr2Int).mDefaultReturn;
  if ((_Rb_tree_header *)cVar3._M_node !=
      &(pAVar1->Am_Map_CStr2Int).mMap._M_t._M_impl.super__Rb_tree_header) {
    pp_Var7 = &cVar3._M_node[1]._M_parent;
  }
  uVar6 = *(uint *)pp_Var7;
  if (uVar6 == 0xffffffff) {
    uVar6 = (uint)Am_Register_Slot_Name::current_name;
    local_28 = string;
    puVar4 = (uint *)std::
                     map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                     ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                                   *)Am_Slot_Name_Key_Table,&local_28);
    *puVar4 = uVar6;
    local_28 = (char *)CONCAT44(local_28._4_4_,uVar6);
    ppcVar5 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar2->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar5 = string;
    uVar6 = (uint)Am_Register_Slot_Name::current_name;
    if (uVar6 < 29999) {
      Am_Error("** Am_Register_Slot_Name: too many slot names registered!\n");
    }
    Am_Register_Slot_Name::current_name = Am_Register_Slot_Name::current_name + 1;
  }
  return (Am_Slot_Key)uVar6;
}

Assistant:

Am_Slot_Key
Am_Register_Slot_Name(const char *string)
{
  // current_name stores the next slot key to allocate
  static Am_Slot_Key current_name = SLOT_NAME_START;

  // do we already have a symbol-table?
  verify_slot_name_key_table();

  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key == -1) {
    Am_Slot_Name_Key_Table->Add_Item(current_name, string);

    // do we have an overflow?
    if (current_name + 1 < SLOT_NAME_START) {
      Am_Error("** Am_Register_Slot_Name: too many slot names registered!\n");
    }

    return (current_name++);
  } else {
    return ((Am_Slot_Key)prev_key);
  }
}